

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O1

int cmdline_read(CMDLINE_OPTION *options,int argc,char **argv,
                _func_int_int_char_ptr_void_ptr *callback,void *userdata)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  CMDLINE_OPTION *pCVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  int *piVar9;
  int iVar10;
  char *pcVar11;
  int iVar12;
  CMDLINE_OPTION *pCVar13;
  int iVar14;
  size_t sVar15;
  char auxbuf [33];
  char local_58 [40];
  
  local_58[0x20] = 0;
  if (options->id == 0) {
    bVar2 = false;
  }
  else {
    piVar9 = &options[1].id;
    bVar2 = true;
    do {
      if (((*(byte *)(piVar9 + -5) & 4) != 0) && (**(char **)(piVar9 + -8) != '-')) {
        bVar2 = false;
      }
      iVar14 = *piVar9;
      piVar9 = piVar9 + 6;
    } while (iVar14 != 0);
    bVar2 = !bVar2;
  }
  if (1 < argc) {
    iVar14 = 1;
    bVar4 = false;
    do {
      if (bVar4) {
LAB_0010526a:
        iVar6 = (*callback)(0,argv[iVar14],userdata);
      }
      else {
        pcVar11 = argv[iVar14];
        iVar6 = strcmp(pcVar11,"-");
        if (iVar6 == 0) goto LAB_0010526a;
        iVar6 = strcmp(pcVar11,"--");
        if (iVar6 == 0) {
          bVar4 = true;
          iVar6 = 0;
        }
        else {
          if ((bVar2) || (*pcVar11 == '-')) {
            iVar6 = 0;
            iVar12 = options->id;
            pCVar13 = options;
            while (bVar4 = false, iVar12 != 0) {
              uVar1 = pCVar13->flags;
              pcVar11 = pCVar13->longname;
              if ((uVar1 & 4) == 0) {
                if (pcVar11 != (char *)0x0) {
                  pcVar8 = argv[iVar14];
                  iVar7 = strncmp(pcVar8,"--",2);
                  if (iVar7 == 0) {
                    sVar15 = strlen(pcVar11);
                    iVar7 = strncmp(pcVar8 + 2,pcVar11,sVar15);
                    if (iVar7 == 0) {
                      if (pcVar8[sVar15 + 2] == '=') {
                        if ((uVar1 & 3) == 0) {
                          pcVar8 = local_58;
                          snprintf(pcVar8,0x20,"--%s",pcVar11);
                          iVar12 = -0x7ffffffd;
                        }
                        else {
                          pcVar8 = pcVar8 + 2 + sVar15 + 1;
                        }
                        iVar6 = (*callback)(iVar12,pcVar8,userdata);
                        bVar3 = true;
                      }
                      else if (pcVar8[sVar15 + 2] == '\0') {
                        if ((uVar1 & 2) == 0) {
                          pcVar8 = (char *)0x0;
                        }
                        else {
                          iVar12 = -0x7ffffffe;
                        }
                        iVar6 = (*callback)(iVar12,pcVar8,userdata);
                        bVar3 = true;
                      }
                      else {
                        bVar3 = false;
                      }
                    }
                    else {
                      bVar3 = false;
                    }
                    if (!bVar3) goto LAB_0010547a;
                    break;
                  }
                }
                if (pCVar13->shortname != '\0') {
                  pcVar11 = argv[iVar14];
                  if ((*pcVar11 == '-') && (pcVar11[1] == pCVar13->shortname)) {
                    if ((uVar1 & 2) == 0) {
                      iVar6 = (*callback)(iVar12,(char *)0x0,userdata);
                      if (iVar6 == 0) {
                        if (argv[iVar14][2] == '\0') {
                          iVar6 = 0;
                        }
                        else {
                          iVar6 = cmdline_handle_short_opt_group
                                            (options,argv[iVar14] + 2,callback,userdata);
                        }
                      }
                      break;
                    }
                    if (pcVar11[2] == '\0') {
                      iVar7 = iVar14 + 1;
                      if (iVar7 < argc) {
                        iVar6 = (*callback)(iVar12,argv[iVar7],userdata);
                        iVar14 = iVar7;
                        break;
                      }
                      iVar12 = -0x7ffffffe;
                    }
                    else {
                      pcVar11 = pcVar11 + 2;
                    }
                    iVar6 = (*callback)(iVar12,pcVar11,userdata);
                    break;
                  }
                }
              }
              else {
                sVar15 = strlen(pcVar11);
                pcVar8 = argv[iVar14];
                iVar7 = strncmp(pcVar8,pcVar11,sVar15);
                if (iVar7 == 0) {
                  if (pcVar8[sVar15] == '\0') {
                    iVar10 = iVar14 + 1;
                    if (iVar10 < argc) {
                      iVar6 = (*callback)(iVar12,argv[iVar10],userdata);
                      iVar14 = iVar10;
                      goto LAB_0010546c;
                    }
                    iVar12 = -0x7ffffffe;
                  }
                  else {
                    pcVar11 = pcVar8 + sVar15;
                  }
                  iVar6 = (*callback)(iVar12,pcVar11,userdata);
                }
LAB_0010546c:
                if (iVar7 == 0) break;
              }
LAB_0010547a:
              pCVar5 = pCVar13 + 1;
              pCVar13 = pCVar13 + 1;
              iVar12 = pCVar5->id;
            }
            if (pCVar13->id != 0) goto LAB_00105281;
            pcVar11 = argv[iVar14];
            if (*pcVar11 != '-') goto LAB_00105650;
            iVar6 = strncmp(pcVar11,"--",2);
            if ((iVar6 == 0) && (pcVar8 = strchr(pcVar11,0x3d), pcVar8 != (char *)0x0)) {
              sVar15 = (long)pcVar8 - (long)pcVar11;
              if (0x1f < sVar15) {
                sVar15 = 0x20;
              }
              strncpy(local_58,pcVar11,sVar15);
              local_58[sVar15] = '\0';
              pcVar11 = local_58;
            }
            iVar6 = -0x7fffffff;
          }
          else {
LAB_00105650:
            iVar6 = 0;
          }
          bVar4 = false;
          iVar6 = (*callback)(iVar6,pcVar11,userdata);
        }
      }
LAB_00105281:
      if (iVar6 != 0) {
        return iVar6;
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < argc);
  }
  return 0;
}

Assistant:

int
cmdline_read(const CMDLINE_OPTION* options, int argc, char** argv,
        int (*callback)(int /*optval*/, const char* /*arg*/, void* /*userdata*/),
        void* userdata)
{
    const CMDLINE_OPTION* opt;
    char auxbuf[CMDLINE_AUXBUF_SIZE+1];
    int fast_optarg_decision = 1;
    int after_doubledash = 0;
    int i = 1;
    int ret = 0;

    auxbuf[CMDLINE_AUXBUF_SIZE] = '\0';

    /* Check whether there is any CMDLINE_OPTFLAG_COMPILERLIKE option with
     * a name not starting with '-'. That would imply we can to check for
     * non-option arguments only after refusing all such options. */
    for(opt = options; opt->id != 0; opt++) {
        if((opt->flags & CMDLINE_OPTFLAG_COMPILERLIKE)  &&  opt->longname[0] != '-')
            fast_optarg_decision = 0;
    }

    while(i < argc) {
        if(after_doubledash  ||  strcmp(argv[i], "-") == 0) {
            /* Non-option argument.
             * Standalone "-" usually means "read from stdin" or "write to
             * stdout" so treat it always as a non-option. */
            ret = callback(CMDLINE_OPTID_NONE, argv[i], userdata);
        } else if(strcmp(argv[i], "--") == 0) {
            /* End of options. All the remaining tokens are non-options
             * even if they start with a dash. */
            after_doubledash = 1;
        } else if(fast_optarg_decision  &&  argv[i][0] != '-') {
            /* Non-option argument. */
            ret = callback(CMDLINE_OPTID_NONE, argv[i], userdata);
        } else {
            for(opt = options; opt->id != 0; opt++) {
                if(opt->flags & CMDLINE_OPTFLAG_COMPILERLIKE) {
                    size_t len = strlen(opt->longname);
                    if(strncmp(argv[i], opt->longname, len) == 0) {
                        /* Compiler-like option. */
                        if(argv[i][len] != '\0')
                            ret = callback(opt->id, argv[i] + len, userdata);
                        else if(i+1 < argc)
                            ret = callback(opt->id, argv[++i], userdata);
                        else
                            ret = callback(CMDLINE_OPTID_MISSINGARG, opt->longname, userdata);
                        break;
                    }
                } else if(opt->longname != NULL  &&  strncmp(argv[i], "--", 2) == 0) {
                    size_t len = strlen(opt->longname);
                    if(strncmp(argv[i]+2, opt->longname, len) == 0) {
                        /* Regular long option. */
                        if(argv[i][2+len] == '\0') {
                            /* with no argument provided. */
                            if(!(opt->flags & CMDLINE_OPTFLAG_REQUIREDARG))
                                ret = callback(opt->id, NULL, userdata);
                            else
                                ret = callback(CMDLINE_OPTID_MISSINGARG, argv[i], userdata);
                            break;
                        } else if(argv[i][2+len] == '=') {
                            /* with an argument provided. */
                            if(opt->flags & (CMDLINE_OPTFLAG_OPTIONALARG | CMDLINE_OPTFLAG_REQUIREDARG)) {
                                ret = callback(opt->id, argv[i]+2+len+1, userdata);
                            } else {
                                snprintf(auxbuf, CMDLINE_AUXBUF_SIZE, "--%s", opt->longname);
                                ret = callback(CMDLINE_OPTID_BOGUSARG, auxbuf, userdata);
                            }
                            break;
                        } else {
                            continue;
                        }
                    }
                } else if(opt->shortname != '\0'  &&  argv[i][0] == '-') {
                    if(argv[i][1] == opt->shortname) {
                        /* Regular short option. */
                        if(opt->flags & CMDLINE_OPTFLAG_REQUIREDARG) {
                            if(argv[i][2] != '\0')
                                ret = callback(opt->id, argv[i]+2, userdata);
                            else if(i+1 < argc)
                                ret = callback(opt->id, argv[++i], userdata);
                            else
                                ret = callback(CMDLINE_OPTID_MISSINGARG, argv[i], userdata);
                            break;
                        } else {
                            ret = callback(opt->id, NULL, userdata);

                            /* There might be more (argument-less) short options
                             * grouped together. */
                            if(ret == 0  &&  argv[i][2] != '\0')
                                ret = cmdline_handle_short_opt_group(options, argv[i]+2, callback, userdata);
                            break;
                        }
                    }
                }
            }

            if(opt->id == 0) {  /* still not handled? */
                if(argv[i][0] != '-') {
                    /* Non-option argument. */
                    ret = callback(CMDLINE_OPTID_NONE, argv[i], userdata);
                } else {
                    /* Unknown option. */
                    char* badoptname = argv[i];

                    if(strncmp(badoptname, "--", 2) == 0) {
                        /* Strip any argument from the long option. */
                        char* assignment = strchr(badoptname, '=');
                        if(assignment != NULL) {
                            size_t len = assignment - badoptname;
                            if(len > CMDLINE_AUXBUF_SIZE)
                                len = CMDLINE_AUXBUF_SIZE;
                            strncpy(auxbuf, badoptname, len);
                            auxbuf[len] = '\0';
                            badoptname = auxbuf;
                        }
                    }

                    ret = callback(CMDLINE_OPTID_UNKNOWN, badoptname, userdata);
                }
            }
        }

        if(ret != 0)
            return ret;
        i++;
    }

    return ret;
}